

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall google::protobuf::UninterpretedOption::Clear(UninterpretedOption *this)

{
  string *psVar1;
  long lVar2;
  
  if ((this->_has_bits_[0] & 0x1fe) != 0) {
    if (((this->_has_bits_[0] & 2) != 0) &&
       (psVar1 = this->identifier_value_, psVar1 != (string *)internal::kEmptyString_abi_cxx11_)) {
      psVar1->_M_string_length = 0;
      *(psVar1->_M_dataplus)._M_p = '\0';
    }
    this->positive_int_value_ = 0;
    this->negative_int_value_ = 0;
    this->double_value_ = 0.0;
    if (((this->_has_bits_[0] & 0x20) != 0) &&
       (psVar1 = this->string_value_, psVar1 != (string *)internal::kEmptyString_abi_cxx11_)) {
      psVar1->_M_string_length = 0;
      *(psVar1->_M_dataplus)._M_p = '\0';
    }
    if (((this->_has_bits_[0] & 0x40) != 0) &&
       (psVar1 = this->aggregate_value_, psVar1 != (string *)internal::kEmptyString_abi_cxx11_)) {
      psVar1->_M_string_length = 0;
      *(psVar1->_M_dataplus)._M_p = '\0';
    }
  }
  if (0 < (this->name_).super_RepeatedPtrFieldBase.current_size_) {
    lVar2 = 0;
    do {
      (**(code **)(*(this->name_).super_RepeatedPtrFieldBase.elements_[lVar2] + 0x20))();
      lVar2 = lVar2 + 1;
    } while (lVar2 < (this->name_).super_RepeatedPtrFieldBase.current_size_);
  }
  (this->name_).super_RepeatedPtrFieldBase.current_size_ = 0;
  this->_has_bits_[0] = 0;
  if ((this->_unknown_fields_).fields_ !=
      (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)0x0
     ) {
    UnknownFieldSet::ClearFallback(&this->_unknown_fields_);
    return;
  }
  return;
}

Assistant:

void UninterpretedOption::Clear() {
  if (_has_bits_[1 / 32] & (0xffu << (1 % 32))) {
    if (has_identifier_value()) {
      if (identifier_value_ != &::google::protobuf::internal::kEmptyString) {
        identifier_value_->clear();
      }
    }
    positive_int_value_ = GOOGLE_ULONGLONG(0);
    negative_int_value_ = GOOGLE_LONGLONG(0);
    double_value_ = 0;
    if (has_string_value()) {
      if (string_value_ != &::google::protobuf::internal::kEmptyString) {
        string_value_->clear();
      }
    }
    if (has_aggregate_value()) {
      if (aggregate_value_ != &::google::protobuf::internal::kEmptyString) {
        aggregate_value_->clear();
      }
    }
  }
  name_.Clear();
  ::memset(_has_bits_, 0, sizeof(_has_bits_));
  mutable_unknown_fields()->Clear();
}